

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.hpp
# Opt level: O2

void tl::printError<char_const*>(char **args)

{
  tl *this;
  u32 uVar1;
  u32 uVar2;
  char *pcVar3;
  CStr str_00;
  Str str;
  FmtBuffer local_40;
  
  this = _stderr;
  uVar1 = calcToStringLengthT(*args);
  uVar2 = calcToStringLengthT("\n");
  StrT<char>::StrT(&str,uVar2 + uVar1,'.');
  local_40.size = uVar2 + uVar1 + 1;
  pcVar3 = (char *)(ulong)(uint)local_40.size;
  local_40.start = str._str;
  local_40.end = str._str;
  toStringBufferT(&local_40,*args);
  toStringBufferT(&local_40,"\n");
  local_40.end[-(ulong)(local_40.size == 0)] = '\0';
  CStrT<char>::CStrT((CStrT<char> *)&local_40,&str);
  str_00._str = pcVar3;
  str_00._0_8_ = local_40.end;
  fprintCStr(this,(FILE *)((ulong)local_40.start & 0xffffffff),str_00);
  StrT<char>::~StrT(&str);
  return;
}

Assistant:

static void printError(const Args&... args)
{
    fprint(stderr, args..., "\n");
}